

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_func.cpp
# Opt level: O1

void __thiscall FParser::SF_LineAttack(FParser *this)

{
  AActor *pAVar1;
  int damage;
  AActor *t1;
  FName local_40;
  FName local_3c;
  DAngle local_30;
  DObject *local_28;
  AActor *local_20;
  
  if (2 < this->t_argc) {
    t1 = actorvalue(this->t_argv);
    damage = intvalue(this->t_argv + 2);
    pAVar1 = (AActor *)floatvalue(this->t_argv + 1);
    local_28 = (DObject *)0x0;
    local_20 = pAVar1;
    P_AimLineAttack((AActor *)&stack0xffffffffffffffc8,(DAngle *)t1,2048.0,
                    (FTranslatedLineTarget *)&stack0xffffffffffffffe0,(DAngle *)0x0,
                    (int)&stack0xffffffffffffffd8,(AActor *)0x0,(AActor *)0x0);
    local_3c.Index = 0xcd;
    local_40.Index = 0x40;
    local_30.Degrees = (double)pAVar1;
    P_LineAttack(t1,&stack0xffffffffffffffd0,2048.0,(DAngle *)&stack0xffffffffffffffc8,damage,
                 &local_3c,&local_40,0,(FTranslatedLineTarget *)0x0,(int *)0x0);
    return;
  }
  script_error("Insufficient parameters for \'%s\'\n",(this->t_func).Chars);
  return;
}

Assistant:

void FParser::SF_LineAttack()
{
	AActor	*mo;
	int		damage;
	DAngle angle, slope;

	if (CheckArgs(3))
	{
		mo = actorvalue(t_argv[0]);
		damage = intvalue(t_argv[2]);

		angle = floatvalue(t_argv[1]);
		slope = P_AimLineAttack(mo, angle, MISSILERANGE);

		P_LineAttack(mo, angle, MISSILERANGE, slope, damage, NAME_Hitscan, NAME_BulletPuff);
	}
}